

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

void __thiscall
Function_Pool::AreaInfo::_fill
          (AreaInfo *this,uint32_t x,uint32_t y,uint32_t width_,uint32_t height_,uint32_t count,
          bool yAxis)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last_00;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last_01;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last_02;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first_00;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first_01;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first_02;
  uint uVar1;
  reference pvVar2;
  uint in_ECX;
  value_type in_EDX;
  value_type in_ESI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint in_R8D;
  uint in_R9D;
  byte in_stack_00000008;
  size_t i_1;
  uint32_t previousValue_1;
  uint32_t remainValue_1;
  size_t i;
  uint32_t previousValue;
  uint32_t remainValue;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff80;
  ulong __n;
  value_type local_78;
  uint local_74;
  ulong local_50;
  value_type local_48;
  uint local_44;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_ffffffffffffff80,(size_type)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_ffffffffffffff80,(size_type)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_ffffffffffffff80,(size_type)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_ffffffffffffff80,(size_type)in_RDI);
  if ((in_stack_00000008 & 1) == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff58);
    __first_01._M_current._4_4_ = in_stack_ffffffffffffff74;
    __first_01._M_current._0_4_ = in_stack_ffffffffffffff70;
    __last_01._M_current._4_4_ = in_stack_ffffffffffffff6c;
    __last_01._M_current._0_4_ = in_stack_ffffffffffffff68;
    std::
    fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
              (__first_01,__last_01,
               (uint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff58);
    __first_02._M_current._4_4_ = in_stack_ffffffffffffff74;
    __first_02._M_current._0_4_ = in_stack_ffffffffffffff70;
    __last_02._M_current._4_4_ = in_stack_ffffffffffffff6c;
    __last_02._M_current._0_4_ = in_stack_ffffffffffffff68;
    std::
    fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
              (__first_02,__last_02,
               (uint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_74 = in_ECX % in_R9D;
    local_78 = in_ESI;
    for (__n = 0; __n < in_R9D; __n = __n + 1) {
      uVar1 = in_ECX / in_R9D;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI + 2,__n);
      *pvVar2 = uVar1;
      if (local_74 != 0) {
        local_74 = local_74 - 1;
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_RDI + 2,__n);
        *pvVar2 = *pvVar2 + 1;
      }
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,__n);
      *pvVar2 = local_78;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,__n);
      local_78 = *pvVar2;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI + 2,__n);
      local_78 = local_78 + *pvVar2;
    }
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff58);
    __first._M_current._4_4_ = in_stack_ffffffffffffff74;
    __first._M_current._0_4_ = in_stack_ffffffffffffff70;
    __last._M_current._4_4_ = in_stack_ffffffffffffff6c;
    __last._M_current._0_4_ = in_stack_ffffffffffffff68;
    std::
    fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
              (__first,__last,(uint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff58);
    __first_00._M_current._4_4_ = in_stack_ffffffffffffff74;
    __first_00._M_current._0_4_ = in_stack_ffffffffffffff70;
    __last_00._M_current._4_4_ = in_stack_ffffffffffffff6c;
    __last_00._M_current._0_4_ = in_stack_ffffffffffffff68;
    std::
    fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
              (__first_00,__last_00,
               (uint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_44 = in_R8D % in_R9D;
    local_48 = in_EDX;
    for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
      uVar1 = in_R8D / in_R9D;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI + 3,local_50);
      *pvVar2 = uVar1;
      if (local_44 != 0) {
        local_44 = local_44 - 1;
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_RDI + 3,local_50);
        *pvVar2 = *pvVar2 + 1;
      }
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI + 1,local_50);
      *pvVar2 = local_48;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI + 1,local_50);
      local_48 = *pvVar2;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI + 3,local_50);
      local_48 = local_48 + *pvVar2;
    }
  }
  return;
}

Assistant:

void AreaInfo::_fill( uint32_t x, uint32_t y, uint32_t width_, uint32_t height_, uint32_t count, bool yAxis )
    {
        startX.resize( count );
        startY.resize( count );
        width.resize( count );
        height.resize( count );

        if( yAxis ) { // process by rows
            std::fill( startX.begin(), startX.end(), x );
            std::fill( width.begin(), width.end(), width_ );

            uint32_t remainValue = height_ % count;
            uint32_t previousValue = y;

            for( size_t i = 0; i < count; ++i ) {
                height[i] = height_ / count;
                if( remainValue > 0 ) {
                    --remainValue;
                    ++height[i];
                }
                startY[i] = previousValue;
                previousValue = startY[i] + height[i];
            }
        }
        else { // process by columns
            std::fill( startY.begin(), startY.end(), y );
            std::fill( height.begin(), height.end(), height_ );

            uint32_t remainValue = width_ % count;
            uint32_t previousValue = x;

            for( size_t i = 0; i < count; ++i ) {
                width[i] = width_ / count;
                if( remainValue > 0 ) {
                    --remainValue;
                    ++width[i];
                }
                startX[i] = previousValue;
                previousValue = startX[i] + width[i];
            }
        }
    }